

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u32 selFlags,
                         Expr *pLimit)

{
  Select *pSVar1;
  Expr *pExpr;
  Select *pSVar2;
  u32 uVar3;
  Select *p;
  long in_FS_OFFSET;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  ExprList *local_98;
  SrcList *pSStack_90;
  Expr *local_88;
  ExprList *pEStack_80;
  Expr *local_78;
  ExprList *pEStack_70;
  Select *local_68;
  Select *pSStack_60;
  Expr *local_58;
  With *pWStack_50;
  Window *local_48;
  Window *pWStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = (Select *)sqlite3DbMallocRawNN(pParse->db,0x80);
  p = pSVar1;
  if (pSVar1 == (Select *)0x0) {
    p = (Select *)&local_b8;
  }
  if (pEList == (ExprList *)0x0) {
    pExpr = sqlite3Expr(pParse->db,0xb4,(char *)0x0);
    pEList = sqlite3ExprListAppendNew(pParse->db,pExpr);
  }
  local_48 = (Window *)&DAT_aaaaaaaaaaaaaaaa;
  pWStack_40 = (Window *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  pWStack_50 = (With *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
  pSStack_60 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  pEStack_70 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  pEStack_80 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  pSStack_90 = (SrcList *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  pSVar2 = pSVar1;
  if (pSVar1 == (Select *)0x0) {
    pSVar2 = (Select *)&local_b8;
  }
  pSVar2->pEList = pEList;
  p->op = 0x8b;
  pSVar2->selFlags = selFlags;
  pSVar2->iLimit = 0;
  pSVar2->iOffset = 0;
  uVar3 = pParse->nSelect + 1;
  pParse->nSelect = uVar3;
  pSVar2->selId = uVar3;
  pSVar2->addrOpenEphm[0] = -1;
  pSVar2->addrOpenEphm[1] = -1;
  pSVar2->nSelectRow = 0;
  if (pSrc == (SrcList *)0x0) {
    pSrc = (SrcList *)sqlite3DbMallocZero(pParse->db,0x50);
  }
  pSVar2 = pSVar1;
  if (pSVar1 == (Select *)0x0) {
    pSVar2 = (Select *)&local_b8;
  }
  pSVar2->pSrc = pSrc;
  pSVar2->pWhere = pWhere;
  pSVar2->pGroupBy = pGroupBy;
  pSVar2->pHaving = pHaving;
  pSVar2->pOrderBy = pOrderBy;
  pSVar2->pPrior = (Select *)0x0;
  pSVar2->pNext = (Select *)0x0;
  pSVar2->pLimit = pLimit;
  pSVar2->pWith = (With *)0x0;
  pSVar2->pWin = (Window *)0x0;
  pSVar2->pWinDefn = (Window *)0x0;
  if (pParse->db->mallocFailed != '\0') {
    clearSelect(pParse->db,p,(uint)(p != (Select *)&local_b8));
    pSVar1 = (Select *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pSVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u32 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit          /* LIMIT value.  NULL means not used */
){
  Select *pNew, *pAllocated;
  Select standin;
  pAllocated = pNew = sqlite3DbMallocRawNN(pParse->db, sizeof(*pNew) );
  if( pNew==0 ){
    assert( pParse->db->mallocFailed );
    pNew = &standin;
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0,
                                   sqlite3Expr(pParse->db,TK_ASTERISK,0));
  }
  pNew->pEList = pEList;
  pNew->op = TK_SELECT;
  pNew->selFlags = selFlags;
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selId = ++pParse->nSelect;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->nSelectRow = 0;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(pParse->db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->pPrior = 0;
  pNew->pNext = 0;
  pNew->pLimit = pLimit;
  pNew->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  pNew->pWin = 0;
  pNew->pWinDefn = 0;
#endif
  if( pParse->db->mallocFailed ) {
    clearSelect(pParse->db, pNew, pNew!=&standin);
    pAllocated = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  return pAllocated;
}